

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O2

void bits::detail::
     RadixSort<11u,unsigned_int,unsigned_int,bits::detail::FloatFlip,bits::detail::InvFloatFlip>::
     radix_pass<bits::detail::PassThrough,bits::detail::InvFloatFlip>
               (long keys_in,long keys_out,long values_in,long values_out,uint size,long hist,
               byte shift)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  for (uVar3 = 0; size != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = *(uint *)(keys_in + uVar3 * 4);
    uVar4 = (ulong)(uVar1 >> (shift & 0x1f) & 0x7ff);
    uVar2 = *(uint *)(hist + uVar4 * 4);
    *(uint *)(hist + uVar4 * 4) = uVar2 + 1;
    *(uint *)(keys_out + (ulong)uVar2 * 4) =
         (0xffffffffU - ((int)uVar1 >> 0x1f) | 0x80000000) ^ uVar1;
    *(undefined4 *)(values_out + (ulong)uVar2 * 4) = *(undefined4 *)(values_in + uVar3 * 4);
  }
  return;
}

Assistant:

static inline void radix_pass(const KeyType* __restrict keys_in, KeyType* __restrict keys_out,
        const ValueType* __restrict values_in, ValueType* __restrict values_out, uint32_t size,
        uint32_t* __restrict hist, KeyType shift, PassDecodeOp decode_op, PassEncodeOp encode_op)
    {
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            const KeyType pos = (key >> shift) & kHistMask;
            const uint32_t index = hist[pos]++;
            keys_out[index] = encode_op(key);
            values_out[index] = values_in[i];
        }
    }